

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  size_t sVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  void *pvVar6;
  uint uVar7;
  uchar *d;
  int iVar8;
  ulong uVar9;
  long lVar10;
  void *__s1;
  undefined8 uVar11;
  ulong uVar12;
  bool bVar13;
  uchar header;
  uchar header_1;
  ulong local_b8;
  stbi__write_context *local_b0;
  ulong local_a8;
  void *local_a0;
  undefined8 local_98;
  size_t local_90;
  ulong local_88;
  long local_80;
  int local_74;
  int local_70;
  int local_6c;
  void *local_68;
  long local_60;
  long local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_98 = CONCAT44(in_register_0000000c,comp);
  uVar12 = (ulong)(uint)x;
  bVar13 = (comp - 2U & 0xfffffffd) == 0;
  uVar9 = (ulong)bVar13;
  uVar3 = (uint)bVar13;
  iVar8 = comp - uVar3;
  if ((y | x) < 0) {
    iVar8 = 0;
  }
  else {
    uVar7 = iVar8 < 2 | 2;
    local_68 = data;
    if (stbi_write_tga_with_rle == 0) {
      iVar8 = stbiw__outfile(s,uVar7,0,x,y,comp,0,data,(uint)bVar13,0,"111 221 2222 11",0,0,
                             (ulong)uVar7,0,0,0,0,0,uVar12,(ulong)(uint)y,
                             (ulong)((iVar8 + uVar3) * 8),(ulong)((uint)bVar13 * 8));
    }
    else {
      uVar7 = iVar8 < 2 | 10;
      d = (uchar *)0x0;
      stbiw__writef(s,(char *)(ulong)uVar7,0,0,(ulong)uVar7,0,0,0,0,0,uVar12,(ulong)(uint)y,
                    (ulong)((iVar8 + uVar3) * 8),(ulong)((uint)bVar13 * 8));
      uVar3 = y - 1;
      if (stbi__flip_vertically_on_write != 0) {
        uVar3 = 0;
      }
      uVar7 = -(uint)(stbi__flip_vertically_on_write == 0) | y;
      local_48 = (ulong)uVar7;
      iVar8 = 1;
      if (uVar3 != uVar7) {
        local_50 = 1;
        if (stbi__flip_vertically_on_write == 0) {
          local_50 = 0xffffffff;
        }
        local_74 = (int)local_98 * x;
        local_6c = x + -1;
        local_90 = (size_t)(int)local_98;
        local_58 = (long)x;
        local_88 = (ulong)uVar3;
        iVar8 = uVar3 * local_74;
        local_70 = (int)local_50 * local_74;
        uVar11 = local_98;
        local_b8 = uVar12;
        local_b0 = s;
        local_a8 = uVar9;
        do {
          local_60 = (long)iVar8;
          if (0 < (int)uVar12) {
            local_40 = (long)(local_74 * (int)local_88) + (long)local_68;
            local_80 = (long)local_68 + local_60;
            local_38 = 0;
            do {
              iVar8 = (int)local_38;
              lVar5 = (long)(iVar8 * (int)uVar11);
              __s1 = (void *)(local_40 + lVar5);
              if (iVar8 < local_6c) {
                iVar2 = bcmp(__s1,(void *)((iVar8 + 1) * (int)uVar11 + local_40),local_90);
                sVar1 = local_90;
                iVar8 = iVar8 + 2;
                if (iVar2 == 0) {
                  bVar13 = true;
                  pvVar4 = (void *)0x2;
                  if (iVar8 < (int)uVar12) {
                    lVar10 = (long)iVar8;
                    pvVar6 = (void *)(local_90 * lVar10 + local_80);
                    pvVar4 = (void *)0x2;
                    do {
                      lVar10 = lVar10 + 1;
                      iVar8 = bcmp(__s1,pvVar6,sVar1);
                      if (iVar8 != 0) goto LAB_00103e43;
                      uVar3 = (uint)pvVar4;
                      uVar7 = uVar3 + 1;
                      if (local_58 <= lVar10) break;
                      pvVar6 = (void *)((long)pvVar6 + sVar1);
                      pvVar4 = (void *)(ulong)uVar7;
                    } while (uVar3 < 0x7f);
                    pvVar4 = (void *)(ulong)uVar7;
LAB_00103e43:
                    bVar13 = true;
                    s = local_b0;
                    uVar9 = local_a8;
                    uVar12 = local_b8;
                  }
                }
                else {
                  if ((int)uVar12 <= iVar8) {
                    pvVar4 = (void *)0x2;
                    goto LAB_00103d50;
                  }
                  lVar10 = (long)iVar8;
                  pvVar6 = (void *)(local_90 * lVar10 + local_80);
                  pvVar4 = (void *)0x1;
                  local_a0 = __s1;
                  do {
                    lVar10 = lVar10 + 1;
                    iVar8 = bcmp(__s1,pvVar6,sVar1);
                    if (iVar8 == 0) goto LAB_00103e27;
                    iVar8 = (int)pvVar4;
                    uVar3 = iVar8 + 1;
                    pvVar4 = (void *)(ulong)uVar3;
                    if (local_58 <= lVar10) break;
                    __s1 = (void *)((long)__s1 + sVar1);
                    pvVar6 = (void *)((long)pvVar6 + sVar1);
                  } while (uVar3 < 0x7f);
                  pvVar4 = (void *)(ulong)(iVar8 + 2);
LAB_00103e27:
                  bVar13 = false;
                  s = local_b0;
                  __s1 = local_a0;
                  uVar9 = local_a8;
                  uVar12 = local_b8;
                }
              }
              else {
                pvVar4 = (void *)0x1;
LAB_00103d50:
                bVar13 = false;
              }
              iVar8 = (int)pvVar4;
              if (bVar13) {
                header = (char)pvVar4 + '\x7f';
                (*s->func)(s->context,&header,1);
                uVar11 = local_98;
                stbiw__write_pixel(s,(int)local_98,(int)uVar9,0,(int)__s1,d);
              }
              else {
                header_1 = (char)pvVar4 + 0xff;
                (*s->func)(s->context,&header_1,1);
                sVar1 = local_90;
                uVar11 = local_98;
                local_a0 = pvVar4;
                if (0 < iVar8) {
                  lVar5 = lVar5 + local_80;
                  do {
                    stbiw__write_pixel(s,(int)uVar11,(int)uVar9,0,(int)lVar5,d);
                    lVar5 = lVar5 + sVar1;
                    pvVar4 = (void *)((long)pvVar4 + -1);
                  } while (pvVar4 != (void *)0x0);
                }
                iVar8 = (int)local_a0;
                uVar12 = local_b8;
              }
              uVar3 = iVar8 + (int)local_38;
              local_38 = (ulong)uVar3;
            } while ((int)uVar3 < (int)uVar12);
          }
          local_88 = local_88 + local_50;
          iVar8 = (int)local_60 + local_70;
        } while ((int)local_48 != (int)local_88);
        iVar8 = 1;
      }
    }
  }
  return iVar8;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;
      int jend, jdir;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      if (stbi__flip_vertically_on_write) {
         j = 0;
         jend = y;
         jdir = 1;
      } else {
         j = y-1;
         jend = -1;
         jdir = -1;
      }
      for (; j != jend; j += jdir) {
         unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = STBIW_UCHAR(len - 1);
               s->func(s->context, &header, 1);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = STBIW_UCHAR(len - 129);
               s->func(s->context, &header, 1);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
   }
   return 1;
}